

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_connect(Curl_easy *data,_Bool *done)

{
  void *pvVar1;
  size_t sStack_40;
  CURLcode result;
  size_t real_path_len;
  FILEPROTO *pFStack_30;
  int fd;
  FILEPROTO *file;
  char *real_path;
  _Bool *done_local;
  Curl_easy *data_local;
  
  pFStack_30 = (data->req).p.file;
  if (pFStack_30->path == (char *)0x0) {
    real_path = done;
    done_local = (_Bool *)data;
    data_local._4_4_ =
         Curl_urldecode((data->state).up.path,0,(char **)&file,&stack0xffffffffffffffc0,REJECT_ZERO)
    ;
    if (data_local._4_4_ == CURLE_OK) {
      pvVar1 = memchr(file,0,sStack_40);
      if (pvVar1 == (void *)0x0) {
        real_path_len._4_4_ = open64((char *)file,0);
        pFStack_30->path = (char *)file;
        (*Curl_cfree)(pFStack_30->freepath);
        pFStack_30->freepath = (char *)0x0;
        pFStack_30->freepath = (char *)file;
        pFStack_30->fd = real_path_len._4_4_;
        if (((*(uint *)(done_local + 0x134c) >> 0x14 & 1) == 0) && (real_path_len._4_4_ == -1)) {
          Curl_failf((Curl_easy *)done_local,"Couldn\'t open file %s",
                     *(undefined8 *)(done_local + 0x11e0));
          file_done((Curl_easy *)done_local,CURLE_FILE_COULDNT_READ_FILE,false);
          data_local._4_4_ = CURLE_FILE_COULDNT_READ_FILE;
        }
        else {
          *real_path = '\x01';
          data_local._4_4_ = CURLE_OK;
        }
      }
      else {
        (*Curl_cfree)(file);
        data_local._4_4_ = CURLE_URL_MALFORMAT;
      }
    }
  }
  else {
    *done = true;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode file_connect(struct Curl_easy *data, bool *done)
{
  char *real_path;
  struct FILEPROTO *file = data->req.p.file;
  int fd;
#ifdef DOS_FILESYSTEM
  size_t i;
  char *actual_path;
#endif
  size_t real_path_len;
  CURLcode result;

  if(file->path) {
    /* already connected.
     * the handler->connect_it() is normally only called once, but
     * FILE does a special check on setting up the connection which
     * calls this explicitly. */
    *done = TRUE;
    return CURLE_OK;
  }

  result = Curl_urldecode(data->state.up.path, 0, &real_path,
                          &real_path_len, REJECT_ZERO);
  if(result)
    return result;

#ifdef DOS_FILESYSTEM
  /* If the first character is a slash, and there's
     something that looks like a drive at the beginning of
     the path, skip the slash.  If we remove the initial
     slash in all cases, paths without drive letters end up
     relative to the current directory which isn't how
     browsers work.

     Some browsers accept | instead of : as the drive letter
     separator, so we do too.

     On other platforms, we need the slash to indicate an
     absolute pathname.  On Windows, absolute paths start
     with a drive letter.
  */
  actual_path = real_path;
  if((actual_path[0] == '/') &&
      actual_path[1] &&
     (actual_path[2] == ':' || actual_path[2] == '|')) {
    actual_path[2] = ':';
    actual_path++;
    real_path_len--;
  }

  /* change path separators from '/' to '\\' for DOS, Windows and OS/2 */
  for(i = 0; i < real_path_len; ++i)
    if(actual_path[i] == '/')
      actual_path[i] = '\\';
    else if(!actual_path[i]) { /* binary zero */
      Curl_safefree(real_path);
      return CURLE_URL_MALFORMAT;
    }

  fd = open_readonly(actual_path, O_RDONLY|O_BINARY);
  file->path = actual_path;
#else
  if(memchr(real_path, 0, real_path_len)) {
    /* binary zeroes indicate foul play */
    Curl_safefree(real_path);
    return CURLE_URL_MALFORMAT;
  }

  #ifdef AMIGA_FILESYSTEM
  /*
   * A leading slash in an AmigaDOS path denotes the parent
   * directory, and hence we block this as it is relative.
   * Absolute paths start with 'volumename:', so we check for
   * this first. Failing that, we treat the path as a real unix
   * path, but only if the application was compiled with -lunix.
   */
  fd = -1;
  file->path = real_path;

  if(real_path[0] == '/') {
    extern int __unix_path_semantics;
    if(strchr(real_path + 1, ':')) {
      /* Amiga absolute path */
      fd = open_readonly(real_path + 1, O_RDONLY);
      file->path++;
    }
    else if(__unix_path_semantics) {
      /* -lunix fallback */
      fd = open_readonly(real_path, O_RDONLY);
    }
  }
  #else
  fd = open_readonly(real_path, O_RDONLY);
  file->path = real_path;
  #endif
#endif
  Curl_safefree(file->freepath);
  file->freepath = real_path; /* free this when done */

  file->fd = fd;
  if(!data->state.upload && (fd == -1)) {
    failf(data, "Couldn't open file %s", data->state.up.path);
    file_done(data, CURLE_FILE_COULDNT_READ_FILE, FALSE);
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  *done = TRUE;

  return CURLE_OK;
}